

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O1

int __thiscall cmCPackDebGenerator::createDeb(cmCPackDebGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppbVar2;
  cmCPackLog *pcVar3;
  pointer pcVar4;
  undefined4 uVar5;
  uint uVar6;
  _Alloc_hider _Var7;
  size_type sVar8;
  size_t sVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *__s;
  char *__s_00;
  char *__s_01;
  char *__s_02;
  char *__s_03;
  char *__s_04;
  char *__s_05;
  ostream *poVar17;
  size_t sVar18;
  long *plVar19;
  undefined8 uVar20;
  const_iterator cVar21;
  FILE *__s_06;
  FILE *__stream;
  size_t sVar22;
  size_t sVar23;
  size_type *psVar24;
  pointer pbVar25;
  pointer pbVar26;
  _func_int **pp_Var27;
  char *__end;
  size_t off;
  ulong uVar28;
  Compress c;
  bool bVar29;
  cmCPackDebGenerator *local_24f8;
  string outputFileName;
  string filename_control_tar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arFiles;
  string strGenWDIR;
  string md5filename;
  string compression_suffix;
  string dirName;
  uint local_23e0;
  size_t local_23d0;
  __time_t local_23a8;
  ios_base local_2390 [264];
  char *local_2288;
  char *local_2280;
  char *local_2278;
  char *local_2270;
  string ctlfilename;
  string filename_data_tar;
  string topLevelString;
  _Alloc_hider local_21e8;
  size_type local_21e0;
  string local_2198 [32];
  string local_2178 [32];
  uint local_2158;
  bool local_2154;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  controlExtraList;
  string local_2110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string dbfilename;
  string local_20b0;
  char *local_2090;
  char *local_2088;
  char *local_2080;
  string local_2078;
  string debian_pkg_name;
  cmGeneratedFileStream out;
  
  dbfilename._M_dataplus._M_p = (pointer)&dbfilename.field_2;
  dbfilename._M_string_length = 0;
  dbfilename.field_2._M_local_buf[0] = '\0';
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&out,"GEN_WDIR","");
  local_24f8 = this;
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::append((char *)&dbfilename);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  std::__cxx11::string::append((char *)&dbfilename);
  cmGeneratedFileStream::cmGeneratedFileStream(&out,dbfilename._M_dataplus._M_p,false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"2.0",3);
  std::ios::widen((char)&out +
                  (char)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream[-3]);
  std::ostream::put((char)&out);
  std::ostream::flush();
  cmGeneratedFileStream::~cmGeneratedFileStream(&out);
  ctlfilename._M_dataplus._M_p = (pointer)&ctlfilename.field_2;
  ctlfilename._M_string_length = 0;
  ctlfilename.field_2._M_local_buf[0] = '\0';
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&out,"GEN_WDIR","");
  pcVar14 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
  sVar8 = ctlfilename._M_string_length;
  strlen(pcVar14);
  std::__cxx11::string::_M_replace((ulong)&ctlfilename,0,(char *)sVar8,(ulong)pcVar14);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  std::__cxx11::string::append((char *)&ctlfilename);
  dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&dirName,"GEN_CPACK_DEBIAN_PACKAGE_NAME","");
  pcVar14 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,&dirName);
  std::__cxx11::string::string((string *)&out,pcVar14,(allocator *)&topLevelString);
  cmsys::SystemTools::LowerCase(&debian_pkg_name,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dirName._M_dataplus._M_p != &dirName.field_2) {
    operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_VERSION","");
  pcVar14 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_SECTION","");
  pcVar15 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_PRIORITY","");
  pcVar16 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE","");
  local_2080 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER","");
  local_2088 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION","");
  local_2090 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_DEPENDS","");
  __s = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS","");
  __s_00 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS","");
  __s_01 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE","");
  __s_02 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS","");
  __s_03 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_ENHANCES","");
  __s_04 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_BREAKS","");
  local_2270 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS","");
  local_2278 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_PROVIDES","");
  local_2280 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_REPLACES","");
  local_2288 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_SOURCE","");
  __s_05 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  cmGeneratedFileStream::cmGeneratedFileStream(&out,ctlfilename._M_dataplus._M_p,false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Package: ",9);
  poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&out,debian_pkg_name._M_dataplus._M_p,
                       debian_pkg_name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Version: ",9);
  if (pcVar14 == (char *)0x0) {
    std::ios::clear((int)&local_24f8 +
                    (int)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3] + 0x4c0);
  }
  else {
    sVar18 = strlen(pcVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar14,sVar18);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Section: ",9);
  if (pcVar15 == (char *)0x0) {
    std::ios::clear((int)&local_24f8 +
                    (int)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3] + 0x4c0);
  }
  else {
    sVar18 = strlen(pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar15,sVar18);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Priority: ",10);
  if (pcVar16 == (char *)0x0) {
    std::ios::clear((int)&local_24f8 +
                    (int)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3] + 0x4c0);
  }
  else {
    sVar18 = strlen(pcVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar16,sVar18);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Architecture: ",0xe);
  pcVar14 = local_2080;
  if (local_2080 == (char *)0x0) {
    std::ios::clear((int)&local_24f8 +
                    (int)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3] + 0x4c0);
  }
  else {
    sVar18 = strlen(local_2080);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar14,sVar18);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  if ((__s_05 != (char *)0x0) && (*__s_05 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Source: ",8);
    sVar18 = strlen(__s_05);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_05,sVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s != (char *)0x0) && (*__s != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Depends: ",9);
    sVar18 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s,sVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s_00 != (char *)0x0) && (*__s_00 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Recommends: ",0xc);
    sVar18 = strlen(__s_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_00,sVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s_01 != (char *)0x0) && (*__s_01 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Suggests: ",10);
    sVar18 = strlen(__s_01);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_01,sVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s_02 != (char *)0x0) && (*__s_02 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Homepage: ",10);
    sVar18 = strlen(__s_02);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_02,sVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s_03 != (char *)0x0) && (*__s_03 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Pre-Depends: ",0xd);
    sVar18 = strlen(__s_03);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_03,sVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((__s_04 != (char *)0x0) && (*__s_04 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Enhances: ",10);
    sVar18 = strlen(__s_04);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,__s_04,sVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((local_2270 != (char *)0x0) && (*local_2270 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Breaks: ",8);
    pcVar14 = local_2270;
    sVar18 = strlen(local_2270);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar14,sVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((local_2278 != (char *)0x0) && (*local_2278 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Conflicts: ",0xb);
    pcVar14 = local_2278;
    sVar18 = strlen(local_2278);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar14,sVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((local_2280 != (char *)0x0) && (*local_2280 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Provides: ",10);
    pcVar14 = local_2280;
    sVar18 = strlen(local_2280);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar14,sVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  if ((local_2288 != (char *)0x0) && (*local_2288 != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Replaces: ",10);
    pcVar14 = local_2288;
    sVar18 = strlen(local_2288);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar14,sVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  }
  topLevelString._M_dataplus._M_p = (pointer)&topLevelString.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&topLevelString,"CPACK_TEMPORARY_DIRECTORY","");
  pcVar14 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,&topLevelString);
  std::__cxx11::string::string((string *)&dirName,pcVar14,(allocator *)&md5filename);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)topLevelString._M_dataplus._M_p != &topLevelString.field_2) {
    operator_delete(topLevelString._M_dataplus._M_p,topLevelString.field_2._M_allocated_capacity + 1
                   );
  }
  std::__cxx11::string::push_back('\0');
  pbVar25 = (local_24f8->packageFiles).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar25 !=
      (local_24f8->packageFiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      cmsys::SystemTools::FileLength(pbVar25);
      pbVar25 = pbVar25 + 1;
    } while (pbVar25 !=
             (local_24f8->packageFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dirName._M_dataplus._M_p != &dirName.field_2) {
    operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Installed-Size: ",0x10);
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Maintainer: ",0xc);
  pcVar14 = local_2088;
  if (local_2088 == (char *)0x0) {
    std::ios::clear((int)&local_24f8 +
                    (int)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3] + 0x4c0);
  }
  else {
    sVar18 = strlen(local_2088);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar14,sVar18);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"Description: ",0xd);
  pcVar14 = local_2090;
  if (local_2090 == (char *)0x0) {
    std::ios::clear((int)&local_24f8 +
                    (int)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3] + 0x4c0);
  }
  else {
    sVar18 = strlen(local_2090);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar14,sVar18);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,"\n",1);
  std::ios::widen((char)&out +
                  (char)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream[-3]);
  std::ostream::put((char)&out);
  std::ostream::flush();
  cmGeneratedFileStream::~cmGeneratedFileStream(&out);
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&out,"GEN_WDIR","");
  pcVar14 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::string((string *)&strGenWDIR,pcVar14,(allocator *)&dirName);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&out,"GEN_CPACK_DEBIAN_COMPRESSION_TYPE","");
  pcVar14 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  pcVar15 = "gzip";
  if (pcVar14 != (char *)0x0) {
    pcVar15 = pcVar14;
  }
  compression_suffix._M_dataplus._M_p = (pointer)&compression_suffix.field_2;
  compression_suffix._M_string_length = 0;
  compression_suffix.field_2._M_local_buf[0] = '\0';
  iVar12 = strcmp(pcVar15,"lzma");
  if (iVar12 == 0) {
    c = CompressLZMA;
    std::__cxx11::string::_M_replace((ulong)&compression_suffix,0,(char *)0x0,0x4ff9c1);
  }
  else {
    iVar12 = strcmp(pcVar15,"xz");
    if (iVar12 == 0) {
      c = CompressXZ;
      std::__cxx11::string::_M_replace((ulong)&compression_suffix,0,(char *)0x0,0x4ff3c4);
    }
    else {
      iVar12 = strcmp(pcVar15,"bzip2");
      if (iVar12 == 0) {
        c = CompressBZip2;
        std::__cxx11::string::_M_replace((ulong)&compression_suffix,0,(char *)0x0,0x4ff3fb);
      }
      else {
        iVar12 = strcmp(pcVar15,"gzip");
        if (iVar12 == 0) {
          c = CompressGZip;
          std::__cxx11::string::_M_replace((ulong)&compression_suffix,0,(char *)0x0,0x50609a);
        }
        else {
          iVar12 = strcmp(pcVar15,"none");
          if (iVar12 == 0) {
            c = CompressNone;
            std::__cxx11::string::_M_replace((ulong)&compression_suffix,0,(char *)0x0,0x550243);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&out,"Error unrecognized compression type: ",0x25);
            sVar18 = strlen(pcVar15);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&out,pcVar15,sVar18);
            std::ios::widen((char)&out +
                            (char)out.super_ofstream.
                                  super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream[-3]);
            std::ostream::put((char)&out);
            std::ostream::flush();
            pcVar3 = (local_24f8->super_cmCPackGenerator).Logger;
            std::__cxx11::stringbuf::str();
            _Var7 = dirName._M_dataplus;
            sVar18 = strlen(dirName._M_dataplus._M_p);
            cmCPackLog::Log(pcVar3,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                            ,0x1bb,_Var7._M_p,sVar18);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)dirName._M_dataplus._M_p != &dirName.field_2) {
              operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        field_0x70);
            c = CompressGZip;
          }
        }
      }
    }
  }
  out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)
       &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&out,strGenWDIR._M_dataplus._M_p,
             strGenWDIR._M_dataplus._M_p + strGenWDIR._M_string_length);
  std::__cxx11::string::append((char *)&out);
  plVar19 = (long *)std::__cxx11::string::_M_append
                              ((char *)&out,(ulong)compression_suffix._M_dataplus._M_p);
  filename_data_tar._M_dataplus._M_p = (pointer)&filename_data_tar.field_2;
  psVar24 = (size_type *)(plVar19 + 2);
  if ((size_type *)*plVar19 == psVar24) {
    filename_data_tar.field_2._M_allocated_capacity = *psVar24;
    filename_data_tar.field_2._8_8_ = plVar19[3];
  }
  else {
    filename_data_tar.field_2._M_allocated_capacity = *psVar24;
    filename_data_tar._M_dataplus._M_p = (pointer)*plVar19;
  }
  filename_data_tar._M_string_length = plVar19[1];
  *plVar19 = (long)psVar24;
  plVar19[1] = 0;
  *(undefined1 *)(plVar19 + 2) = 0;
  if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  cmGeneratedFileStream::cmGeneratedFileStream(&out);
  cmGeneratedFileStream::Open(&out,filename_data_tar._M_dataplus._M_p,false,true);
  if (((&out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&dirName,"paxr","");
    cmArchiveWrite::cmArchiveWrite((cmArchiveWrite *)&topLevelString,(ostream *)&out,c,&dirName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dirName._M_dataplus._M_p != &dirName.field_2) {
      operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
    }
    dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&dirName,"root","");
    md5filename._M_dataplus._M_p = (pointer)&md5filename.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&md5filename,"root","");
    std::__cxx11::string::_M_assign(local_2198);
    std::__cxx11::string::_M_assign(local_2178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)md5filename._M_dataplus._M_p != &md5filename.field_2) {
      operator_delete(md5filename._M_dataplus._M_p,md5filename.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dirName._M_dataplus._M_p != &dirName.field_2) {
      operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
    }
    sVar8 = strGenWDIR._M_string_length;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dirName,"WDIR: \"",7);
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&dirName,strGenWDIR._M_dataplus._M_p,strGenWDIR._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\", length = ",0xc);
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
    std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    pcVar3 = (local_24f8->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    _Var7 = md5filename._M_dataplus;
    sVar18 = strlen(md5filename._M_dataplus._M_p);
    cmCPackLog::Log(pcVar3,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x1dc,_Var7._M_p,sVar18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)md5filename._M_dataplus._M_p != &md5filename.field_2) {
      operator_delete(md5filename._M_dataplus._M_p,md5filename.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
    std::ios_base::~ios_base(local_2390);
    md5filename.field_2._8_8_ = &md5filename._M_string_length;
    md5filename._M_string_length._0_4_ = 0;
    md5filename.field_2._M_allocated_capacity = 0;
    pbVar25 = (local_24f8->packageFiles).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar25 !=
        (local_24f8->packageFiles).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
        pcVar4 = (pbVar25->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&dirName,pcVar4,pcVar4 + pbVar25->_M_string_length);
        while ((dirName._M_string_length != strGenWDIR._M_string_length ||
               ((dirName._M_string_length != 0 &&
                (iVar12 = bcmp(dirName._M_dataplus._M_p,strGenWDIR._M_dataplus._M_p,
                               dirName._M_string_length), iVar12 != 0))))) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&md5filename,&dirName);
          outputFileName._M_dataplus._M_p = (pointer)&outputFileName.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&outputFileName,"..","");
          cmSystemTools::CollapseCombinedPath(&filename_control_tar,&dirName,&outputFileName);
          std::__cxx11::string::operator=((string *)&dirName,(string *)&filename_control_tar);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)filename_control_tar._M_dataplus._M_p != &filename_control_tar.field_2) {
            operator_delete(filename_control_tar._M_dataplus._M_p,
                            filename_control_tar.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)outputFileName._M_dataplus._M_p != &outputFileName.field_2) {
            operator_delete(outputFileName._M_dataplus._M_p,
                            outputFileName.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dirName._M_dataplus._M_p != &dirName.field_2) {
          operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
        }
        pbVar25 = pbVar25 + 1;
      } while (pbVar25 !=
               (local_24f8->packageFiles).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    bVar29 = (size_type *)md5filename.field_2._8_8_ == &md5filename._M_string_length;
    uVar20 = md5filename.field_2._8_8_;
    while (!bVar29) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dirName,"FILEIT: \"",9);
      poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&dirName,*(char **)(uVar20 + 0x20),
                           (long)((_Rb_tree_node_base *)(uVar20 + 0x20))->_M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\"",1);
      std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
      std::ostream::put((char)poVar17);
      std::ostream::flush();
      pcVar3 = (local_24f8->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      _Var7 = filename_control_tar._M_dataplus;
      sVar18 = strlen(filename_control_tar._M_dataplus._M_p);
      cmCPackLog::Log(pcVar3,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x1f6,_Var7._M_p,sVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename_control_tar._M_dataplus._M_p != &filename_control_tar.field_2) {
        operator_delete(filename_control_tar._M_dataplus._M_p,
                        filename_control_tar.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
      std::ios_base::~ios_base(local_2390);
      std::__cxx11::string::find((char)(_Rb_tree_node_base *)(uVar20 + 0x20),0x2f);
      std::__cxx11::string::substr((ulong)&filename_control_tar,(ulong)(uVar20 + 0x20));
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dirName,"RELATIVEDIR: \"",0xe);
      poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&dirName,filename_control_tar._M_dataplus._M_p,
                           filename_control_tar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\"",1);
      std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
      std::ostream::put((char)poVar17);
      std::ostream::flush();
      pcVar3 = (local_24f8->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      _Var7 = outputFileName._M_dataplus;
      sVar18 = strlen(outputFileName._M_dataplus._M_p);
      cmCPackLog::Log(pcVar3,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x1fb,_Var7._M_p,sVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outputFileName._M_dataplus._M_p != &outputFileName.field_2) {
        operator_delete(outputFileName._M_dataplus._M_p,
                        outputFileName.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
      std::ios_base::~ios_base(local_2390);
      local_20b0._M_dataplus._M_p = (pointer)&local_20b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_20b0,*(long *)(uVar20 + 0x20),
                 (long)&((_Rb_tree_node_base *)(uVar20 + 0x20))->_M_parent->_M_color +
                 *(long *)(uVar20 + 0x20));
      bVar10 = cmArchiveWrite::Add((cmArchiveWrite *)&topLevelString,&local_20b0,sVar8,".",false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_20b0._M_dataplus._M_p != &local_20b0.field_2) {
        operator_delete(local_20b0._M_dataplus._M_p,local_20b0.field_2._M_allocated_capacity + 1);
      }
      if (bVar10) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)filename_control_tar._M_dataplus._M_p != &filename_control_tar.field_2) {
          operator_delete(filename_control_tar._M_dataplus._M_p,
                          filename_control_tar.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dirName,"Problem adding file to tar:",0x1b);
        std::ios::widen((char)*(undefined8 *)(dirName._M_dataplus._M_p + -0x18));
        std::ostream::put('\0');
        poVar17 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"#top level directory: ",0x16);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar17,strGenWDIR._M_dataplus._M_p,strGenWDIR._M_string_length);
        std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
        std::ostream::put((char)poVar17);
        poVar17 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"#file: ",7);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar17,*(char **)(uVar20 + 0x20),
                             (long)((_Rb_tree_node_base *)(uVar20 + 0x20))->_M_parent);
        std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
        std::ostream::put((char)poVar17);
        poVar17 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"#error:",7);
        outputFileName._M_dataplus._M_p = (pointer)&outputFileName.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&outputFileName,local_21e8._M_p,local_21e8._M_p + local_21e0);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar17,outputFileName._M_dataplus._M_p,outputFileName._M_string_length
                            );
        std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
        std::ostream::put((char)poVar17);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)outputFileName._M_dataplus._M_p != &outputFileName.field_2) {
          operator_delete(outputFileName._M_dataplus._M_p,
                          outputFileName.field_2._M_allocated_capacity + 1);
        }
        pcVar3 = (local_24f8->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        _Var7 = outputFileName._M_dataplus;
        sVar18 = strlen(outputFileName._M_dataplus._M_p);
        cmCPackLog::Log(pcVar3,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                        ,0x205,_Var7._M_p,sVar18);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)outputFileName._M_dataplus._M_p != &outputFileName.field_2) {
          operator_delete(outputFileName._M_dataplus._M_p,
                          outputFileName.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
        std::ios_base::~ios_base(local_2390);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)filename_control_tar._M_dataplus._M_p != &filename_control_tar.field_2) {
          operator_delete(filename_control_tar._M_dataplus._M_p,
                          filename_control_tar.field_2._M_allocated_capacity + 1);
        }
        if (!bVar10) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&md5filename);
          cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)&topLevelString);
          cmGeneratedFileStream::~cmGeneratedFileStream(&out);
          iVar12 = 0;
          if (bVar29) goto LAB_0025b7ad;
          goto LAB_0025cdee;
        }
      }
      uVar20 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar20);
      bVar29 = (size_type *)uVar20 == &md5filename._M_string_length;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&md5filename);
    cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)&topLevelString);
    cmGeneratedFileStream::~cmGeneratedFileStream(&out);
LAB_0025b7ad:
    md5filename._M_dataplus._M_p = (pointer)&md5filename.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&md5filename,strGenWDIR._M_dataplus._M_p,
               strGenWDIR._M_dataplus._M_p + strGenWDIR._M_string_length);
    std::__cxx11::string::append((char *)&md5filename);
    cmGeneratedFileStream::cmGeneratedFileStream(&out,md5filename._M_dataplus._M_p,false);
    dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&dirName,"CPACK_TEMPORARY_DIRECTORY","");
    pcVar14 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,&dirName);
    std::__cxx11::string::string
              ((string *)&filename_control_tar,pcVar14,(allocator *)&topLevelString);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dirName._M_dataplus._M_p != &dirName.field_2) {
      operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::push_back((char)&filename_control_tar);
    pbVar25 = (local_24f8->packageFiles).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar25 !=
        (local_24f8->packageFiles).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      paVar1 = &outputFileName.field_2;
      do {
        bVar29 = cmsys::SystemTools::FileIsDirectory(pbVar25);
        if ((!bVar29) && (bVar29 = cmsys::SystemTools::FileIsSymlink(pbVar25), !bVar29)) {
          bVar29 = cmSystemTools::ComputeFileMD5(pbVar25,(char *)&topLevelString);
          if (!bVar29) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&dirName,"Problem computing the md5 of ",0x1d);
            poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&dirName,(pbVar25->_M_dataplus)._M_p,
                                 pbVar25->_M_string_length);
            std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
            std::ostream::put((char)poVar17);
            std::ostream::flush();
            pcVar3 = (local_24f8->super_cmCPackGenerator).Logger;
            std::__cxx11::stringbuf::str();
            _Var7 = outputFileName._M_dataplus;
            sVar18 = strlen(outputFileName._M_dataplus._M_p);
            cmCPackLog::Log(pcVar3,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                            ,0x223,_Var7._M_p,sVar18);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)outputFileName._M_dataplus._M_p != paVar1) {
              operator_delete(outputFileName._M_dataplus._M_p,
                              outputFileName.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
            std::ios_base::~ios_base(local_2390);
          }
          dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
          sVar18 = strlen((char *)&topLevelString);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&dirName,&topLevelString,
                     (long)&topLevelString._M_dataplus._M_p + sVar18);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &arFiles,"  ",pbVar25);
          plVar19 = (long *)std::__cxx11::string::append((char *)&arFiles);
          psVar24 = (size_type *)(plVar19 + 2);
          if ((size_type *)*plVar19 == psVar24) {
            outputFileName.field_2._M_allocated_capacity = *psVar24;
            outputFileName.field_2._8_8_ = plVar19[3];
            outputFileName._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            outputFileName.field_2._M_allocated_capacity = *psVar24;
            outputFileName._M_dataplus._M_p = (pointer)*plVar19;
          }
          outputFileName._M_string_length = plVar19[1];
          *plVar19 = (long)psVar24;
          plVar19[1] = 0;
          *(undefined1 *)(plVar19 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&dirName,(ulong)outputFileName._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)outputFileName._M_dataplus._M_p != paVar1) {
            operator_delete(outputFileName._M_dataplus._M_p,
                            outputFileName.field_2._M_allocated_capacity + 1);
          }
          if (arFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&arFiles.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(arFiles.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((arFiles.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_dataplus)._M_p + 1));
          }
          cmsys::SystemTools::ReplaceString(&dirName,filename_control_tar._M_dataplus._M_p,"");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&out,dirName._M_dataplus._M_p,dirName._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dirName._M_dataplus._M_p != &dirName.field_2) {
            operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
          }
        }
        pbVar25 = pbVar25 + 1;
      } while (pbVar25 !=
               (local_24f8->packageFiles).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filename_control_tar._M_dataplus._M_p != &filename_control_tar.field_2) {
      operator_delete(filename_control_tar._M_dataplus._M_p,
                      filename_control_tar.field_2._M_allocated_capacity + 1);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&out);
    filename_control_tar._M_dataplus._M_p = (pointer)&filename_control_tar.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&filename_control_tar,strGenWDIR._M_dataplus._M_p,
               strGenWDIR._M_dataplus._M_p + strGenWDIR._M_string_length);
    std::__cxx11::string::append((char *)&filename_control_tar);
    cmGeneratedFileStream::cmGeneratedFileStream(&out);
    cmGeneratedFileStream::Open(&out,filename_control_tar._M_dataplus._M_p,false,true);
    if (((&out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [(long)out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                _vptr_basic_ostream[-3]] & 5) == 0) {
      dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&dirName,"paxr","");
      cmArchiveWrite::cmArchiveWrite
                ((cmArchiveWrite *)&topLevelString,(ostream *)&out,CompressGZip,&dirName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirName._M_dataplus._M_p != &dirName.field_2) {
        operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
      }
      dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&dirName,"root","");
      outputFileName._M_dataplus._M_p = (pointer)&outputFileName.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&outputFileName,"root","");
      std::__cxx11::string::_M_assign(local_2198);
      std::__cxx11::string::_M_assign(local_2178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outputFileName._M_dataplus._M_p != &outputFileName.field_2) {
        operator_delete(outputFileName._M_dataplus._M_p,
                        outputFileName.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirName._M_dataplus._M_p != &dirName.field_2) {
        operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
      }
      local_2154 = true;
      local_2158 = 0x1a4;
      local_2078._M_dataplus._M_p = (pointer)&local_2078.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2078,md5filename._M_dataplus._M_p,
                 md5filename._M_dataplus._M_p +
                 CONCAT44(md5filename._M_string_length._4_4_,
                          (undefined4)md5filename._M_string_length));
      bVar10 = cmArchiveWrite::Add((cmArchiveWrite *)&topLevelString,&local_2078,
                                   strGenWDIR._M_string_length,".",true);
      bVar29 = true;
      if (bVar10) {
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__str,strGenWDIR._M_dataplus._M_p,
                   strGenWDIR._M_dataplus._M_p + strGenWDIR._M_string_length);
        std::__cxx11::string::append((char *)&__str);
        bVar29 = cmArchiveWrite::Add((cmArchiveWrite *)&topLevelString,&__str,
                                     strGenWDIR._M_string_length,".",true);
        bVar29 = !bVar29;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2078._M_dataplus._M_p != &local_2078.field_2) {
        operator_delete(local_2078._M_dataplus._M_p,local_2078.field_2._M_allocated_capacity + 1);
      }
      if (bVar29) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dirName,"Error adding file to tar:",0x19);
        std::ios::widen((char)*(undefined8 *)(dirName._M_dataplus._M_p + -0x18));
        std::ostream::put('\0');
        poVar17 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"#top level directory: ",0x16);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar17,strGenWDIR._M_dataplus._M_p,strGenWDIR._M_string_length);
        std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
        std::ostream::put((char)poVar17);
        poVar17 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar17,"#file: \"control\" or \"md5sums\"",0x1d);
        std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
        std::ostream::put((char)poVar17);
        poVar17 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"#error:",7);
        outputFileName._M_dataplus._M_p = (pointer)&outputFileName.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&outputFileName,local_21e8._M_p,local_21e8._M_p + local_21e0);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar17,outputFileName._M_dataplus._M_p,outputFileName._M_string_length
                            );
        std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
        std::ostream::put((char)poVar17);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)outputFileName._M_dataplus._M_p != &outputFileName.field_2) {
          operator_delete(outputFileName._M_dataplus._M_p,
                          outputFileName.field_2._M_allocated_capacity + 1);
        }
        pcVar3 = (local_24f8->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        _Var7 = outputFileName._M_dataplus;
        sVar18 = strlen(outputFileName._M_dataplus._M_p);
        cmCPackLog::Log(pcVar3,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                        ,0x262,_Var7._M_p,sVar18);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)outputFileName._M_dataplus._M_p != &outputFileName.field_2) {
          operator_delete(outputFileName._M_dataplus._M_p,
                          outputFileName.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
        std::ios_base::~ios_base(local_2390);
      }
      else {
        dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&dirName,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA","");
        pcVar14 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,&dirName);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dirName._M_dataplus._M_p != &dirName.field_2) {
          operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
        }
        if (pcVar14 != (char *)0x0) {
          dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&dirName,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION","");
          bVar10 = cmCPackGenerator::IsSet(&local_24f8->super_cmCPackGenerator,&dirName);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dirName._M_dataplus._M_p != &dirName.field_2) {
            operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
          }
          std::
          set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::set<char_const**>((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)&dirName,createDeb::strictFiles,(char **)&copy_ar(CF*,long)::pad);
          local_2154 = false;
          controlExtraList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          controlExtraList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          controlExtraList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          outputFileName._M_dataplus._M_p = (pointer)&outputFileName.field_2;
          sVar18 = strlen(pcVar14);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&outputFileName,pcVar14,pcVar14 + sVar18);
          cmSystemTools::ExpandListArgument(&outputFileName,&controlExtraList,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)outputFileName._M_dataplus._M_p != &outputFileName.field_2) {
            operator_delete(outputFileName._M_dataplus._M_p,
                            outputFileName.field_2._M_allocated_capacity + 1);
          }
          if (controlExtraList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              controlExtraList.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            ppbVar2 = &arFiles.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pbVar25 = controlExtraList.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              cmsys::SystemTools::GetFilenameName(&outputFileName,pbVar25);
              __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__str_1,strGenWDIR._M_dataplus._M_p,
                         strGenWDIR._M_dataplus._M_p + strGenWDIR._M_string_length);
              std::__cxx11::string::append((char *)&__str_1);
              plVar19 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&__str_1,(ulong)outputFileName._M_dataplus._M_p);
              pbVar26 = (pointer)(plVar19 + 2);
              if ((pointer)*plVar19 == pbVar26) {
                arFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(pbVar26->_M_dataplus)._M_p;
                arFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar2;
              }
              else {
                arFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(pbVar26->_M_dataplus)._M_p;
                arFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar19;
              }
              arFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar19[1];
              *plVar19 = (long)pbVar26;
              plVar19[1] = 0;
              *(undefined1 *)(plVar19 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
                operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
              }
              if (bVar10) {
                cVar21 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&dirName,&outputFileName);
                local_2158 = 0x1ed;
                if (cVar21._M_node == (_Base_ptr)&dirName._M_string_length) {
                  local_2158 = 0x1a4;
                }
                local_2154 = true;
              }
              bVar11 = cmsys::SystemTools::CopyFileIfDifferent(pbVar25,(string *)&arFiles);
              if (bVar11) {
                local_2110._M_dataplus._M_p = (pointer)&local_2110.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2110,
                           arFiles.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (long)&((arFiles.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p +
                           (long)&((arFiles.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
                cmArchiveWrite::Add((cmArchiveWrite *)&topLevelString,&local_2110,
                                    strGenWDIR._M_string_length,".",true);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2110._M_dataplus._M_p != &local_2110.field_2) {
                  operator_delete(local_2110._M_dataplus._M_p,
                                  local_2110.field_2._M_allocated_capacity + 1);
                }
              }
              if (arFiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar2) {
                operator_delete(arFiles.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&((arFiles.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_dataplus)._M_p + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)outputFileName._M_dataplus._M_p != &outputFileName.field_2) {
                operator_delete(outputFileName._M_dataplus._M_p,
                                outputFileName.field_2._M_allocated_capacity + 1);
              }
              pbVar25 = pbVar25 + 1;
            } while (pbVar25 !=
                     controlExtraList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&controlExtraList);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&dirName);
        }
      }
      cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)&topLevelString);
      cmGeneratedFileStream::~cmGeneratedFileStream(&out);
      iVar12 = 0;
      if (!bVar29) {
        arFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        arFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        arFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        topLevelString._M_dataplus._M_p = (pointer)&topLevelString.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&topLevelString,strGenWDIR._M_dataplus._M_p,
                   strGenWDIR._M_dataplus._M_p + strGenWDIR._M_string_length);
        std::__cxx11::string::append((char *)&topLevelString);
        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&out,topLevelString._M_dataplus._M_p,
                   topLevelString._M_dataplus._M_p + topLevelString._M_string_length);
        std::__cxx11::string::append((char *)&out);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arFiles,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
        if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream !=
            (_func_int **)
            &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
          operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream,
                          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _16_8_ + 1);
        }
        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&out,topLevelString._M_dataplus._M_p,
                   topLevelString._M_dataplus._M_p + topLevelString._M_string_length);
        std::__cxx11::string::append((char *)&out);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arFiles,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
        if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream !=
            (_func_int **)
            &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
          operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream,
                          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _16_8_ + 1);
        }
        dirName._M_dataplus._M_p = (pointer)&dirName.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&dirName,topLevelString._M_dataplus._M_p,
                   topLevelString._M_dataplus._M_p + topLevelString._M_string_length);
        std::__cxx11::string::append((char *)&dirName);
        plVar19 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&dirName,(ulong)compression_suffix._M_dataplus._M_p);
        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
        pp_Var27 = (_func_int **)(plVar19 + 2);
        if ((_func_int **)*plVar19 == pp_Var27) {
          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var27;
          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = plVar19[3];
        }
        else {
          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var27;
          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
               = (_func_int **)*plVar19;
        }
        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar19[1];
        *plVar19 = (long)pp_Var27;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arFiles,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
        if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream !=
            (_func_int **)
            &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
          operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream,
                          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dirName._M_dataplus._M_p != &dirName.field_2) {
          operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
        }
        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&out,"CPACK_TOPLEVEL_DIRECTORY","");
        pcVar14 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
        std::__cxx11::string::string((string *)&outputFileName,pcVar14,(allocator *)&dirName);
        if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream !=
            (_func_int **)
            &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
          operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream,
                          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _16_8_ + 1);
        }
        std::__cxx11::string::append((char *)&outputFileName);
        out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)&out,"CPACK_OUTPUT_FILE_NAME","");
        cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
        std::__cxx11::string::append((char *)&outputFileName);
        if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream !=
            (_func_int **)
            &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
          operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream,
                          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _16_8_ + 1);
        }
        std::__cxx11::string::string
                  ((string *)&out,outputFileName._M_dataplus._M_p,(allocator *)&dirName);
        __s_06 = (FILE *)cmsys::SystemTools::Fopen((string *)&out,"wb+");
        if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream !=
            (_func_int **)
            &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
          operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream,
                          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _16_8_ + 1);
        }
        if (__s_06 == (FILE *)0x0) {
          iVar12 = -4;
        }
        else {
          fwrite("!<arch>\n",8,1,__s_06);
          iVar12 = 0;
          iVar13 = fseek(__s_06,0,2);
          if (iVar13 == -1) {
            iVar12 = -3;
          }
          else if (arFiles.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   arFiles.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
            iVar12 = 0;
            pbVar25 = arFiles.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              pcVar14 = (pbVar25->_M_dataplus)._M_p;
              std::__cxx11::string::string((string *)&out,pcVar14,(allocator *)&__str_1);
              __stream = (FILE *)cmsys::SystemTools::Fopen((string *)&out,"rb");
              if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                  _vptr_basic_ostream !=
                  (_func_int **)
                  &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
              {
                operator_delete(out.super_ofstream.
                                super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream,
                                out.super_ofstream.
                                super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              }
              if (__stream == (FILE *)0x0) {
                iVar12 = -1;
                bVar29 = false;
              }
              else {
                pcVar16 = strrchr(pcVar14,0x2f);
                pcVar15 = pcVar16 + 1;
                if (pcVar16 == (char *)0x0) {
                  pcVar15 = pcVar14;
                }
                stat64(pcVar14,(stat64 *)&dirName);
                sVar18 = strlen(pcVar15);
                uVar5 = dirName.field_2._12_4_;
                if (0xfffe < (uint)dirName.field_2._12_4_) {
                  uVar5 = 0xffff;
                }
                uVar6 = local_23e0;
                if (0xfffe < local_23e0) {
                  uVar6 = 0xffff;
                }
                if ((sVar18 < 0x11) && (pcVar14 = strchr(pcVar15,0x20), pcVar14 == (char *)0x0)) {
                  sprintf(ar_hb,"%-16.16s%-12ld%-6u%-6u%-8o%-10lld%2s",pcVar15,local_23a8,
                          (ulong)(uint)uVar5,(ulong)uVar6,(ulong)(uint)dirName.field_2._8_4_,
                          local_23d0,"`\n");
                  sVar18 = 0;
                }
                else {
                  sprintf(ar_hb,"%s%-13d%-12ld%-6u%-6u%-8o%-10lld%2s","#1/",sVar18 & 0xffffffff,
                          local_23a8,(ulong)(uint)uVar5,(ulong)uVar6,
                          (ulong)(uint)dirName.field_2._8_4_,local_23d0 + sVar18,"`\n");
                }
                sVar22 = fwrite(ar_hb,1,0x3c,__s_06);
                if (sVar22 == 0x3c) {
                  sVar9 = ar_already_written;
                  if ((sVar18 == 0) ||
                     (sVar22 = fwrite(pcVar15,1,sVar18,__s_06), sVar9 = sVar18, sVar22 == sVar18)) {
                    ar_already_written = sVar9;
                    bVar10 = true;
                    sVar18 = local_23d0;
                    if (local_23d0 != 0) {
                      do {
                        sVar22 = 0x2000;
                        if ((long)sVar18 < 0x2000) {
                          sVar22 = sVar18;
                        }
                        sVar22 = fread(&out,1,sVar22,__stream);
                        if (sVar22 == 0) goto LAB_0025cb3a;
                        sVar18 = sVar18 - sVar22;
                        uVar28 = 0;
                        do {
                          sVar23 = fwrite((void *)((long)&out.super_ofstream.
                                                                                                                    
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream + uVar28),1,sVar22,__s_06);
                          if (sVar23 < sVar22) goto LAB_0025cb3a;
                          sVar22 = sVar22 - uVar28;
                          uVar28 = uVar28 + sVar23;
                        } while (uVar28 < sVar22);
                      } while (sVar18 != 0);
                      if ((((int)local_23d0 + (int)ar_already_written & 1U) != 0) &&
                         (sVar18 = fwrite(&copy_ar(CF*,long)::pad,1,1,__s_06), sVar18 != 1)) {
LAB_0025cb3a:
                        bVar10 = false;
                      }
                    }
                    ar_already_written = 0;
                  }
                  else {
                    bVar10 = false;
                  }
                }
                else {
                  bVar10 = false;
                }
                fclose(__stream);
                bVar29 = (bool)(bVar10 ^ 1);
                if (!bVar10) {
                  iVar12 = -2;
                }
              }
            } while ((!bVar29) &&
                    (pbVar25 = pbVar25 + 1,
                    pbVar25 !=
                    arFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish));
          }
          fclose(__s_06);
        }
        if (iVar12 == 0) {
          iVar12 = 1;
        }
        else {
          out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
               = (_func_int **)
                 &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&out,"CPACK_TEMPORARY_PACKAGE_FILE_NAME","");
          pcVar14 = cmCPackGenerator::GetOption(&local_24f8->super_cmCPackGenerator,(string *)&out);
          std::__cxx11::string::string((string *)&dirName,pcVar14,(allocator *)&__str_1);
          if (out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream !=
              (_func_int **)
              &out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
            operator_delete(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream,
                            out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                            _16_8_ + 1);
          }
          std::__cxx11::string::append((char *)&dirName);
          cmGeneratedFileStream::cmGeneratedFileStream(&out,dirName._M_dataplus._M_p,false);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&out,"# Problem creating archive using: ",0x22);
          plVar19 = (long *)std::ostream::operator<<(&out,iVar12);
          std::ios::widen((char)*(undefined8 *)(*plVar19 + -0x18) + (char)plVar19);
          std::ostream::put((char)plVar19);
          std::ostream::flush();
          cmGeneratedFileStream::~cmGeneratedFileStream(&out);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dirName._M_dataplus._M_p != &dirName.field_2) {
            operator_delete(dirName._M_dataplus._M_p,dirName.field_2._M_allocated_capacity + 1);
          }
          iVar12 = 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)outputFileName._M_dataplus._M_p != &outputFileName.field_2) {
          operator_delete(outputFileName._M_dataplus._M_p,
                          outputFileName.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)topLevelString._M_dataplus._M_p != &topLevelString.field_2) {
          operator_delete(topLevelString._M_dataplus._M_p,
                          topLevelString.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&arFiles);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&dirName,"Error opening the file \"",0x18);
      poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&dirName,filename_control_tar._M_dataplus._M_p,
                           filename_control_tar._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\" for writing",0xd);
      std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
      std::ostream::put((char)poVar17);
      std::ostream::flush();
      pcVar3 = (local_24f8->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      _Var7 = topLevelString._M_dataplus;
      sVar18 = strlen(topLevelString._M_dataplus._M_p);
      cmCPackLog::Log(pcVar3,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x240,_Var7._M_p,sVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)topLevelString._M_dataplus._M_p != &topLevelString.field_2) {
        operator_delete(topLevelString._M_dataplus._M_p,
                        topLevelString.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
      std::ios_base::~ios_base(local_2390);
      cmGeneratedFileStream::~cmGeneratedFileStream(&out);
      iVar12 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filename_control_tar._M_dataplus._M_p != &filename_control_tar.field_2) {
      operator_delete(filename_control_tar._M_dataplus._M_p,
                      filename_control_tar.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)md5filename._M_dataplus._M_p != &md5filename.field_2) {
      operator_delete(md5filename._M_dataplus._M_p,md5filename.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dirName,"Error opening the file \"",0x18);
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&dirName,filename_data_tar._M_dataplus._M_p,
                         filename_data_tar._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\" for writing",0xd);
    std::ios::widen((char)poVar17->_vptr_basic_ostream[-3] + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    pcVar3 = (local_24f8->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    _Var7 = topLevelString._M_dataplus;
    sVar18 = strlen(topLevelString._M_dataplus._M_p);
    cmCPackLog::Log(pcVar3,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x1ca,_Var7._M_p,sVar18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)topLevelString._M_dataplus._M_p != &topLevelString.field_2) {
      operator_delete(topLevelString._M_dataplus._M_p,
                      topLevelString.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
    std::ios_base::~ios_base(local_2390);
    cmGeneratedFileStream::~cmGeneratedFileStream(&out);
    iVar12 = 0;
  }
LAB_0025cdee:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename_data_tar._M_dataplus._M_p != &filename_data_tar.field_2) {
    operator_delete(filename_data_tar._M_dataplus._M_p,
                    filename_data_tar.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)compression_suffix._M_dataplus._M_p != &compression_suffix.field_2) {
    operator_delete(compression_suffix._M_dataplus._M_p,
                    CONCAT71(compression_suffix.field_2._M_allocated_capacity._1_7_,
                             compression_suffix.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strGenWDIR._M_dataplus._M_p != &strGenWDIR.field_2) {
    operator_delete(strGenWDIR._M_dataplus._M_p,strGenWDIR.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)debian_pkg_name._M_dataplus._M_p != &debian_pkg_name.field_2) {
    operator_delete(debian_pkg_name._M_dataplus._M_p,
                    debian_pkg_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ctlfilename._M_dataplus._M_p != &ctlfilename.field_2) {
    operator_delete(ctlfilename._M_dataplus._M_p,
                    CONCAT71(ctlfilename.field_2._M_allocated_capacity._1_7_,
                             ctlfilename.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dbfilename._M_dataplus._M_p != &dbfilename.field_2) {
    operator_delete(dbfilename._M_dataplus._M_p,
                    CONCAT71(dbfilename.field_2._M_allocated_capacity._1_7_,
                             dbfilename.field_2._M_local_buf[0]) + 1);
  }
  return iVar12;
}

Assistant:

int cmCPackDebGenerator::createDeb()
{
  // debian-binary file
  std::string dbfilename;
    dbfilename += this->GetOption("GEN_WDIR");
  dbfilename += "/debian-binary";
    { // the scope is needed for cmGeneratedFileStream
    cmGeneratedFileStream out(dbfilename.c_str());
    out << "2.0";
    out << std::endl; // required for valid debian package
    }

  // control file
  std::string ctlfilename;
    ctlfilename = this->GetOption("GEN_WDIR");
  ctlfilename += "/control";

  // debian policy enforce lower case for package name
  // mandatory entries:
  std::string debian_pkg_name = cmsys::SystemTools::LowerCase(
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_NAME") );
  const char* debian_pkg_version =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_VERSION");
  const char* debian_pkg_section =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SECTION");
  const char* debian_pkg_priority =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PRIORITY");
  const char* debian_pkg_arch =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE");
  const char* maintainer =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER");
  const char* desc =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION");

  // optional entries
  const char* debian_pkg_dep =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DEPENDS");
  const char* debian_pkg_rec =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS");
  const char* debian_pkg_sug =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS");
  const char* debian_pkg_url =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE");
  const char* debian_pkg_predep =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS");
  const char* debian_pkg_enhances =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ENHANCES");
  const char* debian_pkg_breaks =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_BREAKS");
  const char* debian_pkg_conflicts =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS");
  const char* debian_pkg_provides =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PROVIDES");
  const char* debian_pkg_replaces =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_REPLACES");
  const char* debian_pkg_source =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SOURCE");


    { // the scope is needed for cmGeneratedFileStream
    cmGeneratedFileStream out(ctlfilename.c_str());
    out << "Package: " << debian_pkg_name << "\n";
    out << "Version: " << debian_pkg_version << "\n";
    out << "Section: " << debian_pkg_section << "\n";
    out << "Priority: " << debian_pkg_priority << "\n";
    out << "Architecture: " << debian_pkg_arch << "\n";
    if(debian_pkg_source && *debian_pkg_source)
      {
      out << "Source: " << debian_pkg_source << "\n";
      }
    if(debian_pkg_dep && *debian_pkg_dep)
      {
      out << "Depends: " << debian_pkg_dep << "\n";
      }
    if(debian_pkg_rec && *debian_pkg_rec)
      {
      out << "Recommends: " << debian_pkg_rec << "\n";
      }
    if(debian_pkg_sug && *debian_pkg_sug)
      {
      out << "Suggests: " << debian_pkg_sug << "\n";
      }
    if(debian_pkg_url && *debian_pkg_url)
      {
      out << "Homepage: " << debian_pkg_url << "\n";
      }
    if (debian_pkg_predep && *debian_pkg_predep)
      {
      out << "Pre-Depends: " << debian_pkg_predep << "\n";
      }
    if (debian_pkg_enhances && *debian_pkg_enhances)
      {
      out << "Enhances: " << debian_pkg_enhances << "\n";
      }
    if (debian_pkg_breaks && *debian_pkg_breaks)
      {
      out << "Breaks: " << debian_pkg_breaks << "\n";
      }
    if (debian_pkg_conflicts && *debian_pkg_conflicts)
      {
      out << "Conflicts: " << debian_pkg_conflicts << "\n";
      }
    if (debian_pkg_provides && *debian_pkg_provides)
      {
      out << "Provides: " << debian_pkg_provides << "\n";
      }
    if (debian_pkg_replaces && *debian_pkg_replaces)
      {
      out << "Replaces: " << debian_pkg_replaces << "\n";
      }
    unsigned long totalSize = 0;
    {
      std::string dirName = this->GetOption("CPACK_TEMPORARY_DIRECTORY");
      dirName += '/';
      for (std::vector<std::string>::const_iterator fileIt =
           packageFiles.begin();
           fileIt != packageFiles.end(); ++ fileIt )
        {
        totalSize += cmSystemTools::FileLength(*fileIt);
        }
    }
    out << "Installed-Size: " << (totalSize + 1023) / 1024 << "\n";
    out << "Maintainer: " << maintainer << "\n";
    out << "Description: " << desc << "\n";
    out << std::endl;
    }

  const std::string strGenWDIR(this->GetOption("GEN_WDIR"));

  cmArchiveWrite::Compress tar_compression_type = cmArchiveWrite::CompressGZip;
  const char* debian_compression_type =
      this->GetOption("GEN_CPACK_DEBIAN_COMPRESSION_TYPE");
  if(!debian_compression_type)
    {
    debian_compression_type = "gzip";
    }

  std::string compression_suffix;
  if(!strcmp(debian_compression_type, "lzma")) {
      compression_suffix = ".lzma";
      tar_compression_type = cmArchiveWrite::CompressLZMA;
  } else if(!strcmp(debian_compression_type, "xz")) {
      compression_suffix = ".xz";
      tar_compression_type = cmArchiveWrite::CompressXZ;
  } else if(!strcmp(debian_compression_type, "bzip2")) {
      compression_suffix = ".bz2";
      tar_compression_type = cmArchiveWrite::CompressBZip2;
  } else if(!strcmp(debian_compression_type, "gzip")) {
      compression_suffix = ".gz";
      tar_compression_type = cmArchiveWrite::CompressGZip;
  } else if(!strcmp(debian_compression_type, "none")) {
      compression_suffix = "";
      tar_compression_type = cmArchiveWrite::CompressNone;
  } else {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Error unrecognized compression type: "
                    << debian_compression_type << std::endl);
  }


  std::string filename_data_tar = strGenWDIR
      + "/data.tar" + compression_suffix;

  // atomic file generation for data.tar
  {
    cmGeneratedFileStream fileStream_data_tar;
    fileStream_data_tar.Open(filename_data_tar.c_str(), false, true);
    if(!fileStream_data_tar)
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
          "Error opening the file \"" << filename_data_tar << "\" for writing"
          << std::endl);
      return 0;
      }
    cmArchiveWrite data_tar(fileStream_data_tar, tar_compression_type, "paxr");

    // uid/gid should be the one of the root user, and this root user has
    // always uid/gid equal to 0.
    data_tar.SetUIDAndGID(0u, 0u);
    data_tar.SetUNAMEAndGNAME("root", "root");

    // now add all directories which have to be compressed
    // collect all top level install dirs for that
    // e.g. /opt/bin/foo, /usr/bin/bar and /usr/bin/baz would
    // give /usr and /opt
    size_t topLevelLength = strGenWDIR.length();
    cmCPackLogger(cmCPackLog::LOG_DEBUG, "WDIR: \""
            << strGenWDIR
            << "\", length = " << topLevelLength
            << std::endl);
    std::set<std::string> orderedFiles;

    // we have to reconstruct the parent folders as well

    for (std::vector<std::string>::const_iterator fileIt =
         packageFiles.begin();
         fileIt != packageFiles.end(); ++ fileIt )
      {
      std::string currentPath = *fileIt;
      while(currentPath != strGenWDIR)
        {
        // the last one IS strGenWDIR, but we do not want this one:
        // XXX/application/usr/bin/myprogram with GEN_WDIR=XXX/application
        // should not add XXX/application
        orderedFiles.insert(currentPath);
        currentPath = cmSystemTools::CollapseCombinedPath(currentPath, "..");
        }
      }


    for (std::set<std::string>::const_iterator fileIt =
         orderedFiles.begin();
         fileIt != orderedFiles.end(); ++ fileIt )
      {
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "FILEIT: \"" << *fileIt << "\""
                    << std::endl);
      std::string::size_type slashPos = fileIt->find('/', topLevelLength+1);
      std::string relativeDir = fileIt->substr(topLevelLength,
                                               slashPos - topLevelLength);
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "RELATIVEDIR: \"" << relativeDir
                    << "\"" << std::endl);

      // do not recurse because the loop will do it
      if(!data_tar.Add(*fileIt, topLevelLength, ".", false))
        {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Problem adding file to tar:" << std::endl
                      << "#top level directory: "
                      << strGenWDIR << std::endl
                      << "#file: " << *fileIt << std::endl
                      << "#error:" << data_tar.GetError() << std::endl);
        return 0;
        }
      }
  } // scope for file generation


  std::string md5filename = strGenWDIR + "/md5sums";
  {
    // the scope is needed for cmGeneratedFileStream
    cmGeneratedFileStream out(md5filename.c_str());

    std::string topLevelWithTrailingSlash =
        this->GetOption("CPACK_TEMPORARY_DIRECTORY");
    topLevelWithTrailingSlash += '/';
    for (std::vector<std::string>::const_iterator fileIt =
           packageFiles.begin();
         fileIt != packageFiles.end(); ++ fileIt )
      {
      // hash only regular files
      if(   cmSystemTools::FileIsDirectory(*fileIt)
         || cmSystemTools::FileIsSymlink(*fileIt))
        {
        continue;
        }

      char md5sum[33];
      if(!cmSystemTools::ComputeFileMD5(*fileIt, md5sum))
        {
        cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem computing the md5 of "
                      << *fileIt << std::endl);
        }

      md5sum[32] = 0;

      std::string output(md5sum);
      output += "  " + *fileIt + "\n";
      // debian md5sums entries are like this:
      // 014f3604694729f3bf19263bac599765  usr/bin/ccmake
      // thus strip the full path (with the trailing slash)
      cmSystemTools::ReplaceString(output,
                                   topLevelWithTrailingSlash.c_str(), "");
      out << output;
      }
    // each line contains a eol.
    // Do not end the md5sum file with yet another (invalid)
  }



  std::string filename_control_tar = strGenWDIR + "/control.tar.gz";
  // atomic file generation for control.tar
  {
    cmGeneratedFileStream fileStream_control_tar;
    fileStream_control_tar.Open(filename_control_tar.c_str(), false, true);
    if(!fileStream_control_tar)
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
          "Error opening the file \"" << filename_control_tar
          << "\" for writing" << std::endl);
      return 0;
      }
    cmArchiveWrite control_tar(fileStream_control_tar,
                               cmArchiveWrite::CompressGZip,
                               "paxr");

    // sets permissions and uid/gid for the files
    control_tar.SetUIDAndGID(0u, 0u);
    control_tar.SetUNAMEAndGNAME("root", "root");

    /* permissions are set according to
    https://www.debian.org/doc/debian-policy/ch-files.html#s-permissions-owners
    and
    https://lintian.debian.org/tags/control-file-has-bad-permissions.html
    */
    const mode_t permission644 = S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH;
    const mode_t permissionExecute = S_IXUSR | S_IXGRP | S_IXOTH;
    const mode_t permission755 = permission644 | permissionExecute;

    // for md5sum and control (that we have generated here), we use 644
    // (RW-R--R--)
    // so that deb lintian doesn't warn about it
    control_tar.SetPermissions(permission644);

    // adds control and md5sums
    if(   !control_tar.Add(md5filename, strGenWDIR.length(), ".")
       || !control_tar.Add(strGenWDIR + "/control", strGenWDIR.length(), "."))
      {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
            "Error adding file to tar:" << std::endl
            << "#top level directory: "
               << strGenWDIR << std::endl
            << "#file: \"control\" or \"md5sums\"" << std::endl
            << "#error:" << control_tar.GetError() << std::endl);
        return 0;
      }

    // for the other files, we use
    // -either the original permission on the files
    // -either a permission strictly defined by the Debian policies
    const char* controlExtra =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA");
    if( controlExtra )
      {
      // permissions are now controlled by the original file permissions

      const bool permissionStrictPolicy =
        this->IsSet("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_STRICT_PERMISSION");

      static const char* strictFiles[] = {
        "config", "postinst", "postrm", "preinst", "prerm"
        };
      std::set<std::string> setStrictFiles(
        strictFiles,
        strictFiles + sizeof(strictFiles)/sizeof(strictFiles[0]));

      // default
      control_tar.ClearPermissions();

      std::vector<std::string> controlExtraList;
      cmSystemTools::ExpandListArgument(controlExtra, controlExtraList);
      for(std::vector<std::string>::iterator i = controlExtraList.begin();
          i != controlExtraList.end(); ++i)
        {
        std::string filenamename =
          cmsys::SystemTools::GetFilenameName(*i);
        std::string localcopy = strGenWDIR + "/" + filenamename;

        if(permissionStrictPolicy)
          {
          control_tar.SetPermissions(setStrictFiles.count(filenamename) ?
            permission755 : permission644);
          }

        // if we can copy the file, it means it does exist, let's add it:
        if( cmsys::SystemTools::CopyFileIfDifferent(*i, localcopy) )
          {
          control_tar.Add(localcopy, strGenWDIR.length(), ".");
          }
        }
      }
  }


  // ar -r your-package-name.deb debian-binary control.tar.* data.tar.*
  // since debian packages require BSD ar (most Linux distros and even
  // FreeBSD and NetBSD ship GNU ar) we use a copy of OpenBSD ar here.
  std::vector<std::string> arFiles;
  std::string topLevelString = strGenWDIR + "/";
  arFiles.push_back(topLevelString + "debian-binary");
  arFiles.push_back(topLevelString + "control.tar.gz");
  arFiles.push_back(topLevelString + "data.tar" + compression_suffix);
  std::string outputFileName = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  outputFileName += "/";
  outputFileName += this->GetOption("CPACK_OUTPUT_FILE_NAME");
  int res = ar_append(outputFileName.c_str(), arFiles);
  if ( res!=0 )
    {
    std::string tmpFile = this->GetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME");
    tmpFile += "/Deb.log";
    cmGeneratedFileStream ofs(tmpFile.c_str());
    ofs << "# Problem creating archive using: " << res << std::endl;
    return 0;
    }
  return 1;
}